

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

shared_ptr<kratos::Expr> __thiscall kratos::util::mux(util *this,Var *cond,int64_t left,Var *right)

{
  size_type *psVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Expr> sVar4;
  shared_ptr<kratos::Var> local_58;
  undefined1 local_48 [16];
  shared_ptr<kratos::Var> local_38;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &cond->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &right->super_enable_shared_from_this<kratos::Var>);
  ConditionalExpr::create((ConditionalExpr *)local_48,&local_38,left,&local_58);
  if (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((pointer)local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48._0_8_;
  local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_
                )->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_
                )->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(CONCAT44(extraout_var,iVar3) + 400),&local_38);
  if ((pointer)local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  uVar2 = local_48._0_8_;
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  *(Generator **)(uVar2 + 0x200) = (Generator *)CONCAT44(extraout_var_00,iVar3);
  *(undefined8 *)this = local_48._0_8_;
  *(undefined8 *)(this + 8) = local_48._8_8_;
  sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Expr>)
         sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> util::mux(Var &cond, int64_t left, Var &right) {
    auto expr = ConditionalExpr::create(cond.shared_from_this(), left, right.shared_from_this());
    cond.generator()->add_expr(expr);
    expr->set_generator(cond.generator());
    return expr;
}